

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  ulong uVar4;
  char *__s;
  ostream *poVar5;
  size_t sVar6;
  int iVar7;
  cmDocumentationEntry *entry;
  pointer pcVar8;
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,(string *)section);
  poVar5 = std::operator<<(os,local_50);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string(local_50);
  pcVar1 = (section->Entries).
           super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar8 = (section->Entries).
                super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
                _M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar1; pcVar8 = pcVar8 + 1) {
    if ((pcVar8->Name)._M_string_length == 0) {
      std::operator<<(os,"\n");
      this->TextIndent = "";
      PrintFormatted(this,os,(pcVar8->Brief)._M_dataplus._M_p);
    }
    else {
      pp_Var2 = os->_vptr_basic_ostream;
      *(undefined8 *)(&os->field_0x10 + (long)pp_Var2[-3]) = 2;
      p_Var3 = pp_Var2[-3];
      *(uint *)(&os->field_0x18 + (long)p_Var3) =
           *(uint *)(&os->field_0x18 + (long)p_Var3) & 0xffffff4f | 0x20;
      poVar5 = std::operator<<(os,pcVar8->CustomNamePrefix);
      std::operator<<(poVar5,(string *)pcVar8);
      this->TextIndent = "                                 ";
      for (iVar7 = (int)(pcVar8->Name)._M_string_length; iVar7 < 0x1d; iVar7 = iVar7 + 1) {
        std::operator<<(os," ");
      }
      uVar4 = (pcVar8->Name)._M_string_length;
      sVar6 = strlen(this->TextIndent);
      if (sVar6 - 4 < uVar4) {
        std::operator<<(os,"\n");
        __s = this->TextIndent;
        strlen(__s);
        std::ostream::write((char *)os,(long)__s);
      }
      std::operator<<(os,"= ");
      PrintColumn(this,os,(pcVar8->Brief)._M_dataplus._M_p);
      std::operator<<(os,"\n");
    }
  }
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmDocumentationFormatter::PrintSection(
  std::ostream& os, cmDocumentationSection const& section)
{
  os << section.GetName() << "\n";

  const std::vector<cmDocumentationEntry>& entries = section.GetEntries();
  for (cmDocumentationEntry const& entry : entries) {
    if (!entry.Name.empty()) {
      os << std::setw(2) << std::left << entry.CustomNamePrefix << entry.Name;
      this->TextIndent = "                                 ";
      int align = static_cast<int>(strlen(this->TextIndent)) - 4;
      for (int i = static_cast<int>(entry.Name.size()); i < align; ++i) {
        os << " ";
      }
      if (entry.Name.size() > strlen(this->TextIndent) - 4) {
        os << "\n";
        os.write(this->TextIndent, strlen(this->TextIndent) - 2);
      }
      os << "= ";
      this->PrintColumn(os, entry.Brief.c_str());
      os << "\n";
    } else {
      os << "\n";
      this->TextIndent = "";
      this->PrintFormatted(os, entry.Brief.c_str());
    }
  }
  os << "\n";
}